

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::IOEffect::SetEffectDutyCycle(IOEffect *this,KUINT8 EDC)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (EDC < 0x65) {
    this->m_ui8EffDtyCyc = EDC;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SetEffectDutyCycle",&local_39);
  KException::KException<char_const*>
            (this_00,&local_38,7,"Invalid Effect Duty Cycle value. Must be between 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IOEffect::SetEffectDutyCycle(KUINT8 EDC) noexcept(false)
{
    if( EDC > 100 )throw KException( __FUNCTION__, OUT_OF_BOUNDS, "Invalid Effect Duty Cycle value. Must be between 0-100." );

    m_ui8EffDtyCyc = EDC;
}